

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesImageMemoryAliasing.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::sparse::anon_unknown_2::ImageSparseMemoryAliasingCase::createInstance
          (ImageSparseMemoryAliasingCase *this,Context *context)

{
  ImageType IVar1;
  TestInstance *pTVar2;
  
  pTVar2 = (TestInstance *)operator_new(0x90);
  IVar1 = this->m_imageType;
  pTVar2->m_context = context;
  *(undefined4 *)&pTVar2[1].m_context = 0;
  pTVar2[2]._vptr_TestInstance = (_func_int **)0x0;
  pTVar2[2].m_context = (Context *)&pTVar2[1].m_context;
  pTVar2[3]._vptr_TestInstance = (_func_int **)&pTVar2[1].m_context;
  pTVar2[3].m_context = (Context *)0x0;
  pTVar2[4]._vptr_TestInstance = (_func_int **)0x0;
  pTVar2[6]._vptr_TestInstance = (_func_int **)0x0;
  pTVar2[6].m_context = (Context *)0x0;
  pTVar2[5]._vptr_TestInstance = (_func_int **)0x0;
  pTVar2[5].m_context = (Context *)0x0;
  pTVar2->_vptr_TestInstance = (_func_int **)&PTR__SparseResourcesBaseInstance_00cff050;
  *(ImageType *)&pTVar2[7].m_context = IVar1;
  *(uint *)((long)&pTVar2[8]._vptr_TestInstance + 4) = (this->m_imageSize).m_data[2];
  *(undefined8 *)((long)&pTVar2[7].m_context + 4) = *(undefined8 *)(this->m_imageSize).m_data;
  pTVar2[8].m_context = (Context *)this->m_format;
  return pTVar2;
}

Assistant:

TestInstance* ImageSparseMemoryAliasingCase::createInstance (Context& context) const
{
	return new ImageSparseMemoryAliasingInstance(context, m_imageType, m_imageSize, m_format);
}